

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O1

asn_dec_rval_t
SET_OF_decode_uper(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
                  asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  bool bVar1;
  int32_t iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  asn_per_constraint_s *paVar6;
  asn_dec_rval_t aVar11;
  size_t extraout_RDX;
  size_t sVar7;
  long lVar8;
  asn_per_constraint_s *paVar9;
  ulong uVar10;
  void *ptr;
  int repeat;
  asn_codec_ctx_t *local_78;
  int local_6c;
  ulong local_68;
  asn_per_data_t *local_60;
  long local_58;
  void *local_50;
  asn_per_constraint_s *local_48;
  asn_TYPE_member_s *local_40;
  long local_38;
  
  local_40 = td->elements;
  local_50 = *sptr;
  local_6c = 0;
  if ((opt_codec_ctx == (asn_codec_ctx_t *)0x0) ||
     (sVar7 = opt_codec_ctx->max_stack_size, sVar7 == 0)) {
LAB_0014751f:
    local_78 = opt_codec_ctx;
    local_60 = pd;
    if (local_50 == (void *)0x0) {
      local_50 = calloc(1,(long)*td->specifics);
      *sptr = local_50;
      if (local_50 == (void *)0x0) goto LAB_00147550;
    }
    if (constraints == (asn_per_constraints_t *)0x0) {
      paVar9 = &td->per_constraints->size;
      if (td->per_constraints == (asn_per_constraints_t *)0x0) {
        paVar9 = (asn_per_constraint_s *)0x0;
      }
    }
    else {
      paVar9 = &constraints->size;
    }
    if (paVar9 == (asn_per_constraint_s *)0x0) {
      paVar6 = (asn_per_constraint_s *)0x0;
    }
    else {
      paVar6 = paVar9;
      if ((paVar9->flags & APC_EXTENSIBLE) != APC_UNCONSTRAINED) {
        uVar10 = 1;
        iVar2 = per_get_few_bits(local_60,1);
        sVar7 = 0;
        paVar6 = (asn_per_constraint_s *)0x0;
        if (iVar2 == 0) {
          paVar6 = paVar9;
        }
        if (iVar2 < 0) goto LAB_0014770a;
      }
    }
    lVar5 = -1;
    if ((paVar6 != (asn_per_constraint_s *)0x0) && (-1 < paVar6->effective_bits)) {
      uVar3 = per_get_few_bits(local_60,paVar6->effective_bits);
      if ((int)uVar3 < 0) {
        uVar10 = 1;
        goto LAB_00147708;
      }
      lVar5 = (ulong)uVar3 + paVar6->lower_bound;
    }
    uVar10 = 1;
    sVar7 = 0;
    local_48 = paVar6;
    do {
      if (lVar5 < 0) {
        if (paVar6 == (asn_per_constraint_s *)0x0) {
          iVar4 = -1;
        }
        else {
          iVar4 = paVar6->effective_bits;
        }
        lVar5 = uper_get_length(local_60,iVar4,&local_6c);
        if (-1 < lVar5) goto LAB_00147618;
        bVar1 = false;
        sVar7 = 0;
        uVar10 = 1;
        local_58 = lVar5;
      }
      else {
LAB_00147618:
        local_58 = -1;
        lVar8 = lVar5;
        if (lVar5 == 0) {
          bVar1 = true;
        }
        else {
          do {
            local_38 = lVar8;
            local_68 = uVar10;
            local_78 = (asn_codec_ctx_t *)0x0;
            aVar11.code = (*local_40->type->uper_decoder)
                                    (opt_codec_ctx,local_40->type,local_40->per_constraints,
                                     &local_78,local_60);
            uVar10 = (ulong)(uint)aVar11.code;
            if (aVar11.code == (asn_dec_rval_t)0x0) {
              iVar4 = asn_set_add(local_50,local_78);
              uVar10 = 2;
              if (iVar4 != 0) goto LAB_0014767f;
              bVar1 = true;
            }
            else {
LAB_0014767f:
              if (local_78 != (asn_codec_ctx_t *)0x0) {
                (*local_40->type->free_struct)(local_40->type,local_78,0);
              }
              bVar1 = false;
              sVar7 = extraout_RDX;
              local_68 = uVar10;
            }
            paVar6 = local_48;
            uVar10 = local_68;
            if (!bVar1) {
              local_58 = local_38;
              break;
            }
            lVar5 = lVar5 + -1;
            lVar8 = local_38;
          } while (lVar5 != 0);
        }
      }
      if (!bVar1) goto LAB_0014770a;
      lVar5 = local_58;
    } while (local_6c != 0);
    uVar10 = 0;
  }
  else {
    lVar8 = (long)opt_codec_ctx - (long)&local_78;
    lVar5 = -lVar8;
    if (lVar8 < 1) {
      lVar5 = lVar8;
    }
    if (SBORROW8(lVar5,-sVar7) == (long)(lVar5 + sVar7) < 0) goto LAB_0014751f;
LAB_00147550:
    uVar10 = 2;
  }
LAB_00147708:
  sVar7 = 0;
LAB_0014770a:
  aVar11._0_8_ = uVar10 & 0xffffffff;
  aVar11.consumed = sVar7;
  return aVar11;
}

Assistant:

asn_dec_rval_t
SET_OF_decode_uper(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
        asn_per_constraints_t *constraints, void **sptr, asn_per_data_t *pd) {
	asn_dec_rval_t rv;
        asn_SET_OF_specifics_t *specs = (asn_SET_OF_specifics_t *)td->specifics;
	asn_TYPE_member_t *elm = td->elements;	/* Single one */
	void *st = *sptr;
	asn_anonymous_set_ *list;
	asn_per_constraint_t *ct;
	int repeat = 0;
	ssize_t nelems;

	if(ASN__STACK_OVERFLOW_CHECK(opt_codec_ctx))
		ASN__DECODE_FAILED;

	/*
	 * Create the target structure if it is not present already.
	 */
	if(!st) {
		st = *sptr = CALLOC(1, specs->struct_size);
		if(!st) ASN__DECODE_FAILED;
	}                                                                       
	list = _A_SET_FROM_VOID(st);

	/* Figure out which constraints to use */
	if(constraints) ct = &constraints->size;
	else if(td->per_constraints) ct = &td->per_constraints->size;
	else ct = 0;

	if(ct && ct->flags & APC_EXTENSIBLE) {
		int value = per_get_few_bits(pd, 1);
		if(value < 0) ASN__DECODE_STARVED;
		if(value) ct = 0;	/* Not restricted! */
	}

	if(ct && ct->effective_bits >= 0) {
		/* X.691, #19.5: No length determinant */
		nelems = per_get_few_bits(pd, ct->effective_bits);
		ASN_DEBUG("Preparing to fetch %ld+%ld elements from %s",
			(long)nelems, ct->lower_bound, td->name);
		if(nelems < 0)  ASN__DECODE_STARVED;
		nelems += ct->lower_bound;
	} else {
		nelems = -1;
	}

	do {
		int i;
		if(nelems < 0) {
			nelems = uper_get_length(pd,
				ct ? ct->effective_bits : -1, &repeat);
			ASN_DEBUG("Got to decode %d elements (eff %d)",
				(int)nelems, (int)(ct ? ct->effective_bits : -1));
			if(nelems < 0) ASN__DECODE_STARVED;
		}

		for(i = 0; i < nelems; i++) {
			void *ptr = 0;
			ASN_DEBUG("SET OF %s decoding", elm->type->name);
			rv = elm->type->uper_decoder(opt_codec_ctx, elm->type,
				elm->per_constraints, &ptr, pd);
			ASN_DEBUG("%s SET OF %s decoded %d, %p",
				td->name, elm->type->name, rv.code, ptr);
			if(rv.code == RC_OK) {
				if(ASN_SET_ADD(list, ptr) == 0)
					continue;
				ASN_DEBUG("Failed to add element into %s",
					td->name);
				/* Fall through */
				rv.code = RC_FAIL;
			} else {
				ASN_DEBUG("Failed decoding %s of %s (SET OF)",
					elm->type->name, td->name);
			}
			if(ptr) ASN_STRUCT_FREE(*elm->type, ptr);
			return rv;
		}

		nelems = -1;	/* Allow uper_get_length() */
	} while(repeat);

	ASN_DEBUG("Decoded %s as SET OF", td->name);

	rv.code = RC_OK;
	rv.consumed = 0;
	return rv;
}